

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t write_new_bucket(int idx,linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__s;
  array_list_t *array_list;
  long lVar2;
  ion_err_t iVar3;
  int iVar4;
  long bucket_loc;
  size_t sVar5;
  int iVar6;
  undefined8 uStack_50;
  int local_48 [2];
  linear_hash_bucket_t bucket;
  
  if ((FILE *)linear_hash->database == (FILE *)0x0) {
    iVar3 = '\t';
  }
  else {
    local_48[1] = 0;
    bucket.idx = -1;
    bucket.record_count = -1;
    uStack_50 = 0x10beba;
    local_48[0] = idx;
    iVar4 = fseek((FILE *)linear_hash->database,0,2);
    iVar3 = '\r';
    if (iVar4 == 0) {
      uStack_50 = 0x10becf;
      bucket_loc = ftell((FILE *)linear_hash->database);
      uStack_50 = 0x10bee9;
      sVar5 = fwrite(local_48,0x10,1,(FILE *)linear_hash->database);
      iVar3 = '\a';
      if (sVar5 == 1) {
        lVar2 = -((long)(linear_hash->super).record.key_size +
                  (long)(linear_hash->super).record.value_size + 0x13U & 0xfffffffffffffff0);
        iVar4 = (linear_hash->super).record.key_size;
        iVar1 = (linear_hash->super).record.value_size;
        iVar6 = 0;
        bucket.overflow_location = (ion_fpos_t)local_48;
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10bf30;
        memset((void *)((long)local_48 + lVar2),0,(long)iVar1 + (long)iVar4);
        if (0 < linear_hash->records_per_bucket) {
          do {
            iVar4 = (linear_hash->super).record.key_size;
            iVar1 = (linear_hash->super).record.value_size;
            __s = (FILE *)linear_hash->database;
            *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10bf58;
            sVar5 = fwrite((void *)((long)local_48 + lVar2),(long)iVar1 + (long)iVar4 + 4,1,__s);
            if (sVar5 != 1) {
              return '\a';
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < linear_hash->records_per_bucket);
        }
        array_list = linear_hash->bucket_map;
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10bf75;
        iVar3 = array_list_insert(idx,bucket_loc,array_list);
      }
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
write_new_bucket(
	int					idx,
	linear_hash_table_t *linear_hash
) {
	if (linear_hash->database == NULL) {
		return err_file_open_error;
	}

	linear_hash_bucket_t bucket;

	/* initialize bucket fields */
	bucket.idx					= idx;
	bucket.record_count			= 0;
	bucket.overflow_location	= linear_hash_end_of_list;

	/* seek to end of file to append new bucket */
	ion_fpos_t bucket_loc;

	if (0 != fseek(linear_hash->database, 0, SEEK_END)) {
		return err_file_bad_seek;
	}

	bucket_loc = ftell(linear_hash->database);

	/* write bucket data to file */
	if (1 != fwrite(&bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	/* write bucket data to file */
	ion_byte_t record_blank[linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty)];

	memset(record_blank, 0, linear_hash->super.record.key_size + linear_hash->super.record.value_size);

	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		if (1 != fwrite(record_blank, linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty), 1, linear_hash->database)) {
			return err_file_write_error;
		}
	}

	/* write bucket_loc in mapping */
	/* store_bucket_loc_in_map(idx, bucket_loc, linear_hash); */
	ion_err_t err = array_list_insert(idx, bucket_loc, linear_hash->bucket_map);

	if (err != err_ok) {
		return err;
	}

	return err_ok;
}